

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# krb5kdf.c
# Opt level: O0

OSSL_PARAM * krb5kdf_settable_ctx_params(void *ctx,void *provctx)

{
  void *provctx_local;
  void *ctx_local;
  
  return krb5kdf_settable_ctx_params::known_settable_ctx_params;
}

Assistant:

static const OSSL_PARAM *krb5kdf_settable_ctx_params(ossl_unused void *ctx,
                                                     ossl_unused void *provctx)
{
    static const OSSL_PARAM known_settable_ctx_params[] = {
        OSSL_PARAM_utf8_string(OSSL_KDF_PARAM_PROPERTIES, NULL, 0),
        OSSL_PARAM_utf8_string(OSSL_KDF_PARAM_CIPHER, NULL, 0),
        OSSL_PARAM_octet_string(OSSL_KDF_PARAM_KEY, NULL, 0),
        OSSL_PARAM_octet_string(OSSL_KDF_PARAM_CONSTANT, NULL, 0),
        OSSL_PARAM_END
    };
    return known_settable_ctx_params;
}